

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadServiceWrapperBase.cpp
# Opt level: O0

void __thiscall ThreadServiceWrapperBase::ScheduleFinishConcurrent(ThreadServiceWrapperBase *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  DWORD DVar4;
  Recycler *this_00;
  undefined4 *puVar5;
  char16_t *pcVar6;
  ThreadServiceWrapperBase *this_local;
  
  bVar2 = ThreadContext::IsInScript(this->threadContext);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadServiceWrapperBase.cpp"
                       ,0x106,"(!threadContext->IsInScript())","!threadContext->IsInScript()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = ThreadContext::GetRecycler(this->threadContext);
  BVar3 = Memory::Recycler::CollectionInProgress(this_00);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadServiceWrapperBase.cpp"
                       ,0x107,"(threadContext->GetRecycler()->CollectionInProgress())",
                       "threadContext->GetRecycler()->CollectionInProgress()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((this->inIdleCollect & 1U) == 0) {
    if (((DAT_01ec73ca & 1) != 0) &&
       (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,IdleCollectPhase), bVar2)) {
      DVar4 = GetCurrentThreadId();
      pcVar6 = L"scheduled finish";
      if ((this->needIdleCollect & 1U) != 0) {
        pcVar6 = L"reschedule finish";
      }
      Output::Print(L"%04X> Idle collect %s\n",(ulong)DVar4,pcVar6);
      Output::Flush();
    }
    this->needIdleCollect = false;
    ScheduleIdleCollect(this,100,true);
  }
  return;
}

Assistant:

void ThreadServiceWrapperBase::ScheduleFinishConcurrent()
{
    Assert(!threadContext->IsInScript());
    Assert(threadContext->GetRecycler()->CollectionInProgress());

    if (!this->inIdleCollect)
    {
        IDLE_COLLECT_VERBOSE_TRACE(_u("Idle collect %s\n"), needIdleCollect ? _u("reschedule finish") : _u("scheduled finish"));
        this->needIdleCollect = false;
        ScheduleIdleCollect(IdleFinishTicks, true /* schedule as task */);
    }
}